

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O0

bool __thiscall
libcellml::Importer::ImporterImpl::checkComponentForCycles
          (ImporterImpl *this,ComponentPtr *component,History *history)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  IssueImpl *pIVar1;
  AnyCellmlElementImpl *pAVar2;
  undefined8 history_00;
  bool bVar3;
  string *name;
  element_type *peVar4;
  element_type *peVar5;
  element_type *peVar6;
  ImportedEntity local_330;
  string local_320;
  string local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  undefined1 local_220 [8];
  IssuePtr issue_1;
  undefined1 local_1f0 [8];
  ComponentPtr importedComponent;
  string local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  undefined1 local_130 [8];
  IssuePtr issue;
  undefined1 local_110 [8];
  ModelPtr model;
  string local_f8;
  ImportedEntity local_d8;
  string local_c8;
  ComponentConstPtr local_a8;
  undefined1 local_98 [8];
  HistoryEpochPtr h;
  undefined1 local_78 [8];
  ModelPtr componentModel;
  ImportedEntity local_58;
  undefined1 local_48 [8];
  string resolvingUrl;
  History *history_local;
  ComponentPtr *component_local;
  ImporterImpl *this_local;
  
  resolvingUrl.field_2._8_8_ = history;
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             component);
  ImportedEntity::importSource(&local_58);
  resolvingUrl_abi_cxx11_((string *)local_48,this,(ImportSourcePtr *)&local_58);
  std::shared_ptr<libcellml::ImportSource>::~shared_ptr
            ((shared_ptr<libcellml::ImportSource> *)&local_58);
  this_00 = &h.super___shared_ptr<libcellml::HistoryEpoch,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  std::shared_ptr<libcellml::ParentedEntity_const>::shared_ptr<libcellml::Component,void>
            ((shared_ptr<libcellml::ParentedEntity_const> *)this_00,component);
  owningModel((libcellml *)local_78,(ParentedEntityConstPtr *)this_00);
  std::shared_ptr<const_libcellml::ParentedEntity>::~shared_ptr
            ((shared_ptr<const_libcellml::ParentedEntity> *)
             &h.super___shared_ptr<libcellml::HistoryEpoch,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::shared_ptr<libcellml::Component_const>::shared_ptr<libcellml::Component,void>
            ((shared_ptr<libcellml::Component_const> *)&local_a8,component);
  modelUrl_abi_cxx11_(&local_c8,this,(ModelPtr *)local_78);
  createHistoryEpoch((libcellml *)local_98,&local_a8,&local_c8,(string *)local_48);
  std::__cxx11::string::~string((string *)&local_c8);
  std::shared_ptr<const_libcellml::Component>::~shared_ptr(&local_a8);
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             component);
  ImportedEntity::importSource(&local_d8);
  history_00 = resolvingUrl.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,"flatten",
             (allocator<char> *)
             ((long)&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  bVar3 = checkForImportCycles
                    (this,(ImportSourcePtr *)&local_d8,(History *)history_00,
                     (HistoryEpochPtr *)local_98,&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  std::shared_ptr<libcellml::ImportSource>::~shared_ptr
            ((shared_ptr<libcellml::ImportSource> *)&local_d8);
  if (bVar3) {
    this_local._7_1_ = true;
    model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ =
         1;
  }
  else {
    std::
    vector<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
    ::push_back((vector<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
                 *)resolvingUrl.field_2._8_8_,(value_type *)local_98);
    std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)component);
    ImportedEntity::importSource
              ((ImportedEntity *)
               &issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)&issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount);
    ImportSource::model((ImportSource *)local_110);
    std::shared_ptr<libcellml::ImportSource>::~shared_ptr
              ((shared_ptr<libcellml::ImportSource> *)
               &issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    bVar3 = std::operator==((shared_ptr<libcellml::Model> *)local_110,(nullptr_t)0x0);
    if (bVar3) {
      Issue::IssueImpl::create();
      peVar5 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_130);
      pIVar1 = peVar5->mPimpl;
      peVar4 = std::
               __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)component);
      NamedEntity::name_abi_cxx11_(&local_1d0,(NamedEntity *)peVar4);
      std::operator+(&local_1b0,"Component \'",&local_1d0);
      std::operator+(&local_190,&local_1b0,"\' requires a model imported from \'");
      std::operator+(&local_170,&local_190,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
      std::operator+(&local_150,&local_170,"\' which is not available in the importer.");
      Issue::IssueImpl::setDescription(pIVar1,&local_150);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&local_190);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::string::~string((string *)&local_1d0);
      peVar5 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_130);
      peVar6 = std::
               __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&peVar5->mPimpl->mItem);
      pAVar2 = peVar6->mPimpl;
      std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)component);
      ImportedEntity::importSource
                ((ImportedEntity *)
                 &importedComponent.
                  super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      AnyCellmlElement::AnyCellmlElementImpl::setImportSource
                (pAVar2,(ImportSourcePtr *)
                        &importedComponent.
                         super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount);
      std::shared_ptr<libcellml::ImportSource>::~shared_ptr
                ((shared_ptr<libcellml::ImportSource> *)
                 &importedComponent.
                  super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      peVar5 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_130);
      Issue::IssueImpl::setReferenceRule(peVar5->mPimpl,IMPORTER_NULL_MODEL);
      Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)local_130);
      this_local._7_1_ = true;
      model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_
           = 1;
      std::shared_ptr<libcellml::Issue>::~shared_ptr((shared_ptr<libcellml::Issue> *)local_130);
    }
    else {
      name = (string *)
             std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_110);
      peVar4 = std::
               __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)component);
      ImportedEntity::importReference_abi_cxx11_
                ((string *)
                 &issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,&peVar4->super_ImportedEntity);
      ComponentEntity::component((ComponentEntity *)local_1f0,name,(bool)((char)&issue_1 + '\b'));
      std::__cxx11::string::~string
                ((string *)
                 &issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      bVar3 = std::operator==((shared_ptr<libcellml::Component> *)local_1f0,(nullptr_t)0x0);
      if (bVar3) {
        Issue::IssueImpl::create();
        peVar5 = std::
                 __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_220);
        pIVar1 = peVar5->mPimpl;
        peVar4 = std::
                 __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)component);
        NamedEntity::name_abi_cxx11_(&local_300,(NamedEntity *)peVar4);
        std::operator+(&local_2e0,"Component \'",&local_300);
        std::operator+(&local_2c0,&local_2e0,"\' imports a component named \'");
        peVar4 = std::
                 __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)component);
        ImportedEntity::importReference_abi_cxx11_(&local_320,&peVar4->super_ImportedEntity);
        std::operator+(&local_2a0,&local_2c0,&local_320);
        std::operator+(&local_280,&local_2a0,"\' from the model imported from \'");
        std::operator+(&local_260,&local_280,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48
                      );
        std::operator+(&local_240,&local_260,"\'. The component could not be found.");
        Issue::IssueImpl::setDescription(pIVar1,&local_240);
        std::__cxx11::string::~string((string *)&local_240);
        std::__cxx11::string::~string((string *)&local_260);
        std::__cxx11::string::~string((string *)&local_280);
        std::__cxx11::string::~string((string *)&local_2a0);
        std::__cxx11::string::~string((string *)&local_320);
        std::__cxx11::string::~string((string *)&local_2c0);
        std::__cxx11::string::~string((string *)&local_2e0);
        std::__cxx11::string::~string((string *)&local_300);
        peVar5 = std::
                 __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_220);
        peVar6 = std::
                 __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&peVar5->mPimpl->mItem);
        pAVar2 = peVar6->mPimpl;
        std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)component);
        ImportedEntity::importSource(&local_330);
        AnyCellmlElement::AnyCellmlElementImpl::setImportSource
                  (pAVar2,(ImportSourcePtr *)&local_330);
        std::shared_ptr<libcellml::ImportSource>::~shared_ptr
                  ((shared_ptr<libcellml::ImportSource> *)&local_330);
        peVar5 = std::
                 __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_220);
        Issue::IssueImpl::setReferenceRule(peVar5->mPimpl,IMPORTER_MISSING_COMPONENT);
        Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)local_220);
        this_local._7_1_ = true;
        model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _0_4_ = 1;
        std::shared_ptr<libcellml::Issue>::~shared_ptr((shared_ptr<libcellml::Issue> *)local_220);
      }
      else {
        peVar4 = std::
                 __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_1f0);
        bVar3 = ImportedEntity::isImport(&peVar4->super_ImportedEntity);
        if ((bVar3) &&
           (bVar3 = checkComponentForCycles
                              (this,(ComponentPtr *)local_1f0,(History *)resolvingUrl.field_2._8_8_)
           , bVar3)) {
          this_local._7_1_ = true;
          model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
          _0_4_ = 1;
        }
        else {
          this_local._7_1_ = false;
          model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
          _0_4_ = 1;
        }
      }
      std::shared_ptr<libcellml::Component>::~shared_ptr
                ((shared_ptr<libcellml::Component> *)local_1f0);
    }
    std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)local_110);
  }
  std::shared_ptr<libcellml::HistoryEpoch>::~shared_ptr
            ((shared_ptr<libcellml::HistoryEpoch> *)local_98);
  std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)local_78);
  std::__cxx11::string::~string((string *)local_48);
  return this_local._7_1_;
}

Assistant:

bool Importer::ImporterImpl::checkComponentForCycles(const ComponentPtr &component, History &history)
{
    std::string resolvingUrl = ImporterImpl::resolvingUrl(component->importSource());
    auto componentModel = owningModel(component);
    auto h = createHistoryEpoch(component, modelUrl(componentModel), resolvingUrl);

    if (checkForImportCycles(component->importSource(), history, h, "flatten")) {
        return true;
    }

    history.push_back(h);

    // If the dependencies have not been recorded already, then check it.
    auto model = component->importSource()->model();
    if (model == nullptr) {
        auto issue = Issue::IssueImpl::create();
        issue->mPimpl->setDescription("Component '" + component->name() + "' requires a model imported from '" + resolvingUrl + "' which is not available in the importer.");
        issue->mPimpl->mItem->mPimpl->setImportSource(component->importSource());
        issue->mPimpl->setReferenceRule(Issue::ReferenceRule::IMPORTER_NULL_MODEL);
        addIssue(issue);
        return true;
    }
    auto importedComponent = model->component(component->importReference(), true);
    if (importedComponent == nullptr) {
        auto issue = Issue::IssueImpl::create();
        issue->mPimpl->setDescription("Component '" + component->name() + "' imports a component named '" + component->importReference() + "' from the model imported from '" + resolvingUrl + "'. The component could not be found.");
        issue->mPimpl->mItem->mPimpl->setImportSource(component->importSource());
        issue->mPimpl->setReferenceRule(Issue::ReferenceRule::IMPORTER_MISSING_COMPONENT);
        addIssue(issue);
        return true;
    }

    if (importedComponent->isImport() && checkComponentForCycles(importedComponent, history)) {
        return true;
    }

    return false;
}